

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O1

int __thiscall
ON_HistoryRecord::GetPointValues(ON_HistoryRecord *this,int value_id,ON_SimpleArray<ON_3dPoint> *a)

{
  ON_Value *pOVar1;
  
  if (-1 < a->m_capacity) {
    a->m_count = 0;
  }
  pOVar1 = FindValueHelper(this,value_id,5,false);
  if (pOVar1 != (ON_Value *)0x0) {
    ON_SimpleArray<ON_3dPoint>::operator=(a,(ON_SimpleArray<ON_3dPoint> *)(pOVar1 + 1));
  }
  return a->m_count;
}

Assistant:

int ON_HistoryRecord::GetPointValues( int value_id, ON_SimpleArray<ON_3dPoint>& a ) const
{
  a.SetCount(0);
  const ON_PointValue* v = static_cast<ON_PointValue*>(FindValueHelper(value_id,ON_Value::point_value,0));
  if ( v )
  {
    a = v->m_value;
  }
  return a.Count();
}